

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

TestCase * __thiscall doctest::detail::TestCase::operator=(TestCase *this,TestCase *other)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  double dVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined3 uVar12;
  int iVar13;
  undefined4 uVar14;
  String *this_00;
  
  String::operator=((String *)this,(String *)other);
  uVar6 = *(undefined4 *)&(other->super_TestCaseData).field_0x1c;
  pcVar1 = (other->super_TestCaseData).m_name;
  pcVar2 = (other->super_TestCaseData).m_test_suite;
  pcVar3 = (other->super_TestCaseData).m_description;
  pcVar4 = (other->super_TestCaseData).m_description;
  bVar7 = (other->super_TestCaseData).m_skip;
  bVar8 = (other->super_TestCaseData).m_no_breaks;
  bVar9 = (other->super_TestCaseData).m_no_output;
  bVar10 = (other->super_TestCaseData).m_may_fail;
  bVar11 = (other->super_TestCaseData).m_should_fail;
  uVar12 = *(undefined3 *)&(other->super_TestCaseData).field_0x3d;
  iVar13 = (other->super_TestCaseData).m_expected_failures;
  uVar14 = *(undefined4 *)&(other->super_TestCaseData).field_0x44;
  dVar5 = (other->super_TestCaseData).m_timeout;
  (this->super_TestCaseData).m_line = (other->super_TestCaseData).m_line;
  *(undefined4 *)&(this->super_TestCaseData).field_0x1c = uVar6;
  (this->super_TestCaseData).m_name = pcVar1;
  (this->super_TestCaseData).m_test_suite = pcVar2;
  (this->super_TestCaseData).m_description = pcVar3;
  (this->super_TestCaseData).m_description = pcVar4;
  (this->super_TestCaseData).m_skip = bVar7;
  (this->super_TestCaseData).m_no_breaks = bVar8;
  (this->super_TestCaseData).m_no_output = bVar9;
  (this->super_TestCaseData).m_may_fail = bVar10;
  (this->super_TestCaseData).m_should_fail = bVar11;
  *(undefined3 *)&(this->super_TestCaseData).field_0x3d = uVar12;
  (this->super_TestCaseData).m_expected_failures = iVar13;
  *(undefined4 *)&(this->super_TestCaseData).field_0x44 = uVar14;
  (this->super_TestCaseData).m_timeout = dVar5;
  pcVar1 = other->m_type;
  this->m_test = other->m_test;
  this->m_type = pcVar1;
  this->m_template_id = other->m_template_id;
  this_00 = &this->m_full_name;
  String::operator=(this_00,&other->m_full_name);
  if (this->m_template_id != -1) {
    if ((this->m_full_name).field_0.buf[0x17] < '\0') {
      this_00 = (String *)(this->m_full_name).field_0.data.ptr;
    }
    (this->super_TestCaseData).m_name = (char *)this_00;
  }
  return this;
}

Assistant:

TestCase& TestCase::operator=(const TestCase& other) {
        static_cast<TestCaseData&>(*this) = static_cast<const TestCaseData&>(other);

        m_test        = other.m_test;
        m_type        = other.m_type;
        m_template_id = other.m_template_id;
        m_full_name   = other.m_full_name;

        if(m_template_id != -1)
            m_name = m_full_name.c_str();
        return *this;
    }